

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)11>_> *
vkt::QueryPool::anon_unknown_0::makeQueryPool
          (Move<vk::Handle<(vk::HandleType)11>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkQueryPipelineStatisticFlags statisticFlags)

{
  VkQueryPoolCreateInfo queryPoolCreateInfo;
  VkQueryPoolCreateInfo local_28;
  
  local_28.sType = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
  local_28.pNext = (void *)0x0;
  local_28.flags = 0;
  local_28.queryType = VK_QUERY_TYPE_PIPELINE_STATISTICS;
  local_28.queryCount = 1;
  local_28.pipelineStatistics = statisticFlags;
  ::vk::createQueryPool(__return_storage_ptr__,vk,device,&local_28,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkQueryPool> makeQueryPool (const DeviceInterface& vk, const VkDevice device, VkQueryPipelineStatisticFlags statisticFlags)
{
	const VkQueryPoolCreateInfo queryPoolCreateInfo =
	{
		VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO,	// VkStructureType					sType
		DE_NULL,									// const void*						pNext
		(VkQueryPoolCreateFlags)0,					// VkQueryPoolCreateFlags			flags
		VK_QUERY_TYPE_PIPELINE_STATISTICS ,			// VkQueryType						queryType
		1u,											// deUint32							entryCount
		statisticFlags,								// VkQueryPipelineStatisticFlags	pipelineStatistics
	};
	return createQueryPool(vk, device, &queryPoolCreateInfo);
}